

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::Check(Parser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  reference this_00;
  OBS_TYPE obs_00;
  double dVar6;
  vector<int,_std::allocator<int>_> local_b0;
  int local_94;
  undefined1 local_90 [4];
  int j;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> state_1;
  int i;
  OBS_TYPE obs;
  double dStack_48;
  ACT_TYPE action;
  double rand;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> state;
  int s;
  Parser *this_local;
  
  poVar4 = despot::operator<<((ostream *)&std::cout,this);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"# Terminal states:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      iVar3 = state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_, iVar2 = NumStates(this), iVar3 < iVar2;
      state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    ComputeState((vector<int,_std::allocator<int>_> *)local_30,this,
                 state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage._4_4_);
    bVar1 = IsTerminalState(this,(vector<int,_std::allocator<int>_> *)local_30);
    if (bVar1) {
      PrintState(this,(vector<int,_std::allocator<int>_> *)local_30,(ostream *)&std::cout);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  for (state_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      state_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 0x14;
      state_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           state_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    dStack_48 = Random::NextDouble((Random *)&Random::RANDOM);
    ComputeState((vector<int,_std::allocator<int>_> *)local_78,this,dStack_48);
    poVar4 = std::operator<<((ostream *)&std::cout,"s = ");
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_90,
               (vector<int,_std::allocator<int>_> *)local_78);
    poVar4 = despot::operator<<(poVar4,(vector<int,_std::allocator<int>_> *)local_90);
    poVar4 = std::operator<<(poVar4," - ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,dStack_48);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
    PrintState(this,(vector<int,_std::allocator<int>_> *)local_78,(ostream *)&std::cout);
    for (local_94 = 0; local_94 < 2; local_94 = local_94 + 1) {
      this_00 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                          (&this->action_vars_,0);
      iVar3 = Variable::Size(&this_00->super_Variable);
      iVar3 = Random::NextInt((Random *)&Random::RANDOM,iVar3);
      poVar4 = std::operator<<((ostream *)&std::cout,"a = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar3);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      PrintAction(this,iVar3,(ostream *)&std::cout);
      dStack_48 = Random::NextDouble((Random *)&Random::RANDOM);
      GetNextState(this,(vector<int,_std::allocator<int>_> *)local_78,iVar3,&stack0xffffffffffffffb8
                  );
      poVar4 = std::operator<<((ostream *)&std::cout,"s\' = ");
      std::vector<int,_std::allocator<int>_>::vector
                (&local_b0,(vector<int,_std::allocator<int>_> *)local_78);
      poVar4 = despot::operator<<(poVar4,&local_b0);
      poVar4 = std::operator<<(poVar4," - ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,dStack_48);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      std::vector<int,_std::allocator<int>_>::~vector(&local_b0);
      PrintState(this,(vector<int,_std::allocator<int>_> *)local_78,(ostream *)&std::cout);
      poVar4 = std::operator<<((ostream *)&std::cout,"r = ");
      dVar6 = GetReward(this,iVar3);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar6);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      dStack_48 = Random::NextDouble((Random *)&Random::RANDOM);
      obs_00 = GetObservation(this,(vector<int,_std::allocator<int>_> *)local_78,iVar3,
                              &stack0xffffffffffffffb8);
      poVar4 = std::operator<<((ostream *)&std::cout,"o = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,obs_00);
      poVar4 = std::operator<<(poVar4," - ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dStack_48);
      poVar4 = std::operator<<(poVar4," ");
      dVar6 = ObsProb(this,obs_00,(vector<int,_std::allocator<int>_> *)local_78,iVar3);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar6);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      PrintObs(this,obs_00,(ostream *)&std::cout);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"----------------------------------");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  }
  exit(0);
}

Assistant:

void Parser::Check() {
	cout << *this << endl;

	cout << "# Terminal states:" << endl;
	for (int s = 0; s < NumStates(); s++) {
		vector<int> state = ComputeState(s);
		if (IsTerminalState(state))
			PrintState(state);
	}
	cout << endl;

	double rand;
	ACT_TYPE action;
	OBS_TYPE obs;
	for (int i = 0; i < 20; i++) {
		rand = Random::RANDOM.NextDouble();
		vector<int> state = ComputeState(rand);
		cout << "s = " << state << " - " << rand << endl;
		PrintState(state);

		for (int j = 0; j < 2; j++) {
			action = Random::RANDOM.NextInt(action_vars_[0].Size());
			cout << "a = " << action << endl;
			PrintAction(action);
			rand = Random::RANDOM.NextDouble();
			GetNextState(state, action, rand);
			cout << "s' = " << state << " - " << rand << endl;
			PrintState(state);
			cout << "r = " << GetReward(action) << endl;
			rand = Random::RANDOM.NextDouble();
			obs = GetObservation(state, action, rand);
			cout << "o = " << obs << " - " << rand << " "
				<< ObsProb(obs, state, action) << endl;
			PrintObs(obs);
			cout << endl;
		}

		cout << "----------------------------------" << endl;
	}
	exit(0);
}